

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

CURLUcode curl_url_set(CURLU *u,CURLUPart what,char *part,uint flags)

{
  bool bVar1;
  bool bVar2;
  uchar uVar3;
  _Bool _Var4;
  int iVar5;
  CURLUcode CVar6;
  Curl_URL *u_00;
  Curl_handler *pCVar7;
  size_t sVar8;
  uchar *puVar9;
  long lVar10;
  uchar *puVar11;
  Curl_URL *pCVar12;
  size_t sVar13;
  char *pcVar14;
  char cVar15;
  CURLUcode CVar16;
  uchar uVar17;
  CURLU *pCVar18;
  CURLUcode CVar19;
  CURLUcode CVar20;
  CURLUcode CVar21;
  uint uVar22;
  uchar *buffer;
  byte bVar23;
  char *oldurl;
  uchar *local_60;
  char *local_50;
  uchar *local_48;
  ulong local_40;
  long local_38;
  
  bVar23 = 0;
  if (u == (CURLU *)0x0) {
    return CURLUE_BAD_HANDLE;
  }
  if (part == (char *)0x0) {
    switch(what) {
    case CURLUPART_URL:
      u = (CURLU *)0x0;
      break;
    case CURLUPART_SCHEME:
      break;
    case CURLUPART_USER:
      u = (CURLU *)&u->user;
      break;
    case CURLUPART_PASSWORD:
      u = (CURLU *)&u->password;
      break;
    case CURLUPART_OPTIONS:
      u = (CURLU *)&u->options;
      break;
    case CURLUPART_HOST:
      u = (CURLU *)&u->host;
      break;
    case CURLUPART_PORT:
      u->portnum = 0;
      u = (CURLU *)&u->port;
      break;
    case CURLUPART_PATH:
      u = (CURLU *)&u->path;
      break;
    case CURLUPART_QUERY:
      u = (CURLU *)&u->query;
      break;
    case CURLUPART_FRAGMENT:
      u = (CURLU *)&u->fragment;
      break;
    case CURLUPART_ZONEID:
      u = (CURLU *)&u->zoneid;
      break;
    default:
      goto LAB_004d30d5;
    }
    if (u == (CURLU *)0x0) {
      return CURLUE_OK;
    }
    if (u->scheme != (char *)0x0) {
      (*Curl_cfree)(u->scheme);
      u->scheme = (char *)0x0;
      return CURLUE_OK;
    }
    return CURLUE_OK;
  }
  if (CURLUPART_ZONEID < what) {
LAB_004d30d5:
    return CURLUE_UNKNOWN_PART;
  }
  uVar22 = CONCAT31((int3)(flags >> 8),(byte)flags >> 7);
  local_40 = (ulong)uVar22;
  CVar21 = flags;
  switch(what) {
  case CURLUPART_URL:
    _Var4 = Curl_is_absolute_url(part,(char *)0x0,0x29);
    if ((_Var4) || (CVar21 = curl_url_get(u,CURLUPART_URL,&local_50,flags), CVar21 != CURLUE_OK)) {
      u_00 = (Curl_URL *)(*Curl_ccalloc)(0x60,1);
      if (u_00 == (Curl_URL *)0x0) {
        return CURLUE_OUT_OF_MEMORY;
      }
      CVar21 = parseurl(part,u_00,flags);
      if (CVar21 == CURLUE_OK) {
        free_urlhandle(u);
        pCVar12 = u_00;
        for (lVar10 = 0xc; lVar10 != 0; lVar10 = lVar10 + -1) {
          u->scheme = pCVar12->scheme;
          pCVar12 = (Curl_URL *)((long)pCVar12 + (ulong)bVar23 * -0x10 + 8);
          u = (CURLU *)((long)u + (ulong)bVar23 * -0x10 + 8);
        }
      }
      else {
        free_urlhandle(u_00);
      }
    }
    else {
      pCVar12 = (Curl_URL *)concat_url(local_50,part);
      (*Curl_cfree)(local_50);
      if (pCVar12 == (Curl_URL *)0x0) {
        return CURLUE_OUT_OF_MEMORY;
      }
      u_00 = (Curl_URL *)(*Curl_ccalloc)(0x60,1);
      if (u_00 == (Curl_URL *)0x0) {
        CVar21 = CURLUE_OUT_OF_MEMORY;
        u_00 = pCVar12;
      }
      else {
        CVar21 = parseurl((char *)pCVar12,u_00,flags);
        (*Curl_cfree)(pCVar12);
        if (CVar21 == CURLUE_OK) {
          free_urlhandle(u);
          pCVar12 = u_00;
          for (lVar10 = 0xc; lVar10 != 0; lVar10 = lVar10 + -1) {
            u->scheme = pCVar12->scheme;
            pCVar12 = (Curl_URL *)((long)pCVar12 + (ulong)bVar23 * -0x10 + 8);
            u = (CURLU *)((long)u + (ulong)bVar23 * -0x10 + 8);
          }
        }
        else {
          free_urlhandle(u_00);
        }
      }
    }
    (*Curl_cfree)(u_00);
    return CVar21;
  case CURLUPART_SCHEME:
    sVar8 = strlen(part);
    CVar21 = CURLUE_MALFORMED_INPUT;
    if (0x28 < sVar8) {
      return CURLUE_MALFORMED_INPUT;
    }
    bVar23 = 1;
    if (((flags & 8) == 0) && (pCVar7 = Curl_builtin_scheme(part), pCVar7 == (Curl_handler *)0x0)) {
      return CURLUE_UNSUPPORTED_SCHEME;
    }
    CVar6 = CURLUE_OK;
    local_40 = 0;
    uVar22 = 0;
    local_38 = 0;
    pCVar18 = u;
    goto LAB_004d2bba;
  case CURLUPART_USER:
    pCVar18 = (CURLU *)&u->user;
    break;
  case CURLUPART_PASSWORD:
    pCVar18 = (CURLU *)&u->password;
    break;
  case CURLUPART_OPTIONS:
    pCVar18 = (CURLU *)&u->options;
    break;
  case CURLUPART_HOST:
    pCVar18 = (CURLU *)&u->host;
    (*Curl_cfree)(u->zoneid);
    u->zoneid = (char *)0x0;
    break;
  case CURLUPART_PORT:
    local_38 = strtol(part,&local_50,10);
    if (local_38 - 0x10000U < 0xffffffffffff0001) {
      CVar21 = CURLUE_BAD_PORT_NUMBER;
LAB_004d2d9b:
      bVar1 = false;
      pCVar18 = (CURLU *)0x0;
    }
    else {
      if (*local_50 != '\0') {
        CVar21 = CURLUE_MALFORMED_INPUT;
        goto LAB_004d2d9b;
      }
      pCVar18 = (CURLU *)&u->port;
      bVar1 = true;
    }
    if (!bVar1) {
      return CVar21;
    }
    bVar23 = 1;
    CVar6 = CURLUE_OK;
    local_40 = 0;
    uVar22 = 0;
    goto LAB_004d2bba;
  case CURLUPART_PATH:
    pCVar18 = (CURLU *)&u->path;
    bVar23 = 0;
    goto LAB_004d2bb6;
  case CURLUPART_QUERY:
    CVar21 = flags >> 8;
    bVar23 = 1;
    local_38 = 0;
    pCVar18 = (CURLU *)&u->query;
    CVar6 = CVar21;
    goto LAB_004d2bba;
  case CURLUPART_FRAGMENT:
    pCVar18 = (CURLU *)&u->fragment;
    break;
  case CURLUPART_ZONEID:
    pCVar18 = (CURLU *)&u->zoneid;
  }
  bVar23 = 1;
LAB_004d2bb6:
  local_40 = 0;
  local_38 = 0;
  CVar6 = CURLUE_OK;
LAB_004d2bba:
  if (pCVar18 == (CURLU *)0x0) goto LAB_004d30c9;
  sVar8 = strlen(part);
  if (sVar8 < 0x7a1201) {
    if ((char)uVar22 == '\0') {
      local_60 = (uchar *)(*Curl_cstrdup)(part);
      puVar9 = local_60;
      if (local_60 != (uchar *)0x0) {
        do {
          lVar10 = 1;
          if (*puVar9 == '%') {
            iVar5 = Curl_isxdigit((uint)puVar9[1]);
            if (((iVar5 != 0) && (iVar5 = Curl_isxdigit((uint)puVar9[2]), iVar5 != 0)) &&
               ((iVar5 = Curl_isupper((uint)puVar9[1]), iVar5 != 0 ||
                (iVar5 = Curl_isupper((uint)puVar9[2]), iVar5 != 0)))) {
              iVar5 = tolower((uint)puVar9[1]);
              puVar9[1] = (uchar)iVar5;
              iVar5 = tolower((uint)puVar9[2]);
              puVar9[2] = (uchar)iVar5;
              lVar10 = 3;
            }
          }
          else if (*puVar9 == '\0') goto LAB_004d2d79;
          puVar9 = puVar9 + lVar10;
        } while( true );
      }
      CVar21 = CURLUE_OUT_OF_MEMORY;
LAB_004d2d79:
      if (local_60 != (uchar *)0x0) goto LAB_004d2fa2;
    }
    else {
      puVar9 = (uchar *)(*Curl_cmalloc)(sVar8 * 3 + 1);
      if (puVar9 == (uchar *)0x0) {
        CVar21 = CURLUE_OUT_OF_MEMORY;
        bVar1 = false;
        local_60 = (uchar *)part;
      }
      else {
        puVar11 = (uchar *)part;
        if ((char)local_40 == '\0') {
LAB_004d2de4:
          uVar3 = *puVar11;
          buffer = puVar9;
          local_48 = puVar11;
          if (uVar3 != '\0') {
            cVar15 = (char)local_40;
            CVar19 = CVar6;
            do {
              _Var4 = Curl_isunreserved(uVar3);
              if ((_Var4) || (uVar3 = *puVar11, (bool)(~bVar23 & uVar3 == '/'))) {
LAB_004d2e78:
                CVar16 = CVar19 & 0xff;
                CVar20 = CVar16;
                if ((CVar19 & CURLUE_BAD_HANDLE) != CURLUE_OK) {
                  CVar20 = CURLUE_OK;
                }
                CVar19 = CVar20;
                if (*puVar11 != '=') {
                  CVar19 = CVar16;
                }
                *buffer = *puVar11;
                lVar10 = 1;
              }
              else {
                if (uVar3 == '=') {
                  if ((CVar19 & CURLUE_BAD_HANDLE) != CURLUE_OK) goto LAB_004d2e78;
                }
                else if (uVar3 == '+' && cVar15 == '\x01') goto LAB_004d2e78;
                curl_msnprintf((char *)buffer,4,"%%%02x");
                lVar10 = 3;
              }
              buffer = buffer + lVar10;
              uVar3 = puVar11[1];
              puVar11 = puVar11 + 1;
            } while (uVar3 != '\0');
          }
          *buffer = '\0';
          bVar1 = true;
          local_60 = puVar9;
          bVar2 = true;
          if ((char)local_40 == '\0') goto LAB_004d2f94;
        }
        else {
          lVar10 = 0;
          while( true ) {
            uVar3 = part[lVar10];
            uVar17 = '+';
            if ((uVar3 != ' ') && (uVar17 = uVar3, uVar3 == '\0')) break;
            puVar9[lVar10] = uVar17;
            lVar10 = lVar10 + 1;
          }
          puVar9[lVar10] = '\0';
          puVar11 = (uchar *)(*Curl_cstrdup)((char *)puVar9);
          if (puVar11 != (uchar *)0x0) goto LAB_004d2de4;
          CVar21 = CURLUE_OUT_OF_MEMORY;
          local_60 = (uchar *)part;
          local_48 = puVar9;
          bVar2 = false;
        }
        bVar1 = bVar2;
        (*Curl_cfree)(local_48);
      }
LAB_004d2f94:
      if (bVar1) {
LAB_004d2fa2:
        if ((CVar6 & CURLUE_BAD_HANDLE) != CURLUE_OK) {
          pcVar14 = u->query;
          if (pcVar14 == (char *)0x0) {
            sVar8 = 0;
          }
          else {
            sVar8 = strlen(pcVar14);
          }
          if (sVar8 != 0) {
            cVar15 = pcVar14[sVar8 - 1];
            sVar13 = strlen((char *)local_60);
            lVar10 = (cVar15 != '&') + sVar8;
            pcVar14 = (char *)(*Curl_cmalloc)(sVar13 + lVar10 + 1);
            if (pcVar14 == (char *)0x0) {
              (*Curl_cfree)(local_60);
              CVar21 = CURLUE_OUT_OF_MEMORY;
            }
            else {
              strcpy(pcVar14,u->query);
              if (cVar15 != '&') {
                pcVar14[sVar8] = '&';
              }
              strcpy(pcVar14 + lVar10,(char *)local_60);
              (*Curl_cfree)(local_60);
              (*Curl_cfree)(pCVar18->scheme);
              pCVar18->scheme = pcVar14;
              CVar21 = CURLUE_OK;
            }
          }
          if (sVar8 != 0) goto LAB_004d307a;
        }
        if ((what == CURLUPART_HOST) &&
           (CVar6 = hostname_check(u,(char *)local_60), CVar6 != CURLUE_OK)) {
          (*Curl_cfree)(local_60);
          goto LAB_004d2bdd;
        }
        (*Curl_cfree)(pCVar18->scheme);
        pCVar18->scheme = (char *)local_60;
        bVar1 = true;
        goto LAB_004d30c0;
      }
    }
LAB_004d307a:
    bVar1 = false;
  }
  else {
LAB_004d2bdd:
    bVar1 = false;
    CVar21 = CURLUE_MALFORMED_INPUT;
  }
LAB_004d30c0:
  if (!bVar1) {
    return CVar21;
  }
LAB_004d30c9:
  if (local_38 != 0) {
    u->portnum = local_38;
  }
  return CURLUE_OK;
}

Assistant:

CURLUcode curl_url_set(CURLU *u, CURLUPart what,
                       const char *part, unsigned int flags)
{
  char **storep = NULL;
  long port = 0;
  bool urlencode = (flags & CURLU_URLENCODE)? 1 : 0;
  bool plusencode = FALSE;
  bool urlskipslash = FALSE;
  bool appendquery = FALSE;
  bool equalsencode = FALSE;

  if(!u)
    return CURLUE_BAD_HANDLE;
  if(!part) {
    /* setting a part to NULL clears it */
    switch(what) {
    case CURLUPART_URL:
      break;
    case CURLUPART_SCHEME:
      storep = &u->scheme;
      break;
    case CURLUPART_USER:
      storep = &u->user;
      break;
    case CURLUPART_PASSWORD:
      storep = &u->password;
      break;
    case CURLUPART_OPTIONS:
      storep = &u->options;
      break;
    case CURLUPART_HOST:
      storep = &u->host;
      break;
    case CURLUPART_ZONEID:
      storep = &u->zoneid;
      break;
    case CURLUPART_PORT:
      u->portnum = 0;
      storep = &u->port;
      break;
    case CURLUPART_PATH:
      storep = &u->path;
      break;
    case CURLUPART_QUERY:
      storep = &u->query;
      break;
    case CURLUPART_FRAGMENT:
      storep = &u->fragment;
      break;
    default:
      return CURLUE_UNKNOWN_PART;
    }
    if(storep && *storep) {
      free(*storep);
      *storep = NULL;
    }
    return CURLUE_OK;
  }

  switch(what) {
  case CURLUPART_SCHEME:
    if(strlen(part) > MAX_SCHEME_LEN)
      /* too long */
      return CURLUE_MALFORMED_INPUT;
    if(!(flags & CURLU_NON_SUPPORT_SCHEME) &&
       /* verify that it is a fine scheme */
       !Curl_builtin_scheme(part))
      return CURLUE_UNSUPPORTED_SCHEME;
    storep = &u->scheme;
    urlencode = FALSE; /* never */
    break;
  case CURLUPART_USER:
    storep = &u->user;
    break;
  case CURLUPART_PASSWORD:
    storep = &u->password;
    break;
  case CURLUPART_OPTIONS:
    storep = &u->options;
    break;
  case CURLUPART_HOST:
    storep = &u->host;
    free(u->zoneid);
    u->zoneid = NULL;
    break;
  case CURLUPART_ZONEID:
    storep = &u->zoneid;
    break;
  case CURLUPART_PORT:
  {
    char *endp;
    urlencode = FALSE; /* never */
    port = strtol(part, &endp, 10);  /* Port number must be decimal */
    if((port <= 0) || (port > 0xffff))
      return CURLUE_BAD_PORT_NUMBER;
    if(*endp)
      /* weirdly provided number, not good! */
      return CURLUE_MALFORMED_INPUT;
    storep = &u->port;
  }
  break;
  case CURLUPART_PATH:
    urlskipslash = TRUE;
    storep = &u->path;
    break;
  case CURLUPART_QUERY:
    plusencode = urlencode;
    appendquery = (flags & CURLU_APPENDQUERY)?1:0;
    equalsencode = appendquery;
    storep = &u->query;
    break;
  case CURLUPART_FRAGMENT:
    storep = &u->fragment;
    break;
  case CURLUPART_URL: {
    /*
     * Allow a new URL to replace the existing (if any) contents.
     *
     * If the existing contents is enough for a URL, allow a relative URL to
     * replace it.
     */
    CURLUcode result;
    char *oldurl;
    char *redired_url;
    CURLU *handle2;

    if(Curl_is_absolute_url(part, NULL, MAX_SCHEME_LEN + 1)) {
      handle2 = curl_url();
      if(!handle2)
        return CURLUE_OUT_OF_MEMORY;
      result = parseurl(part, handle2, flags);
      if(!result)
        mv_urlhandle(handle2, u);
      else
        curl_url_cleanup(handle2);
      return result;
    }
    /* extract the full "old" URL to do the redirect on */
    result = curl_url_get(u, CURLUPART_URL, &oldurl, flags);
    if(result) {
      /* couldn't get the old URL, just use the new! */
      handle2 = curl_url();
      if(!handle2)
        return CURLUE_OUT_OF_MEMORY;
      result = parseurl(part, handle2, flags);
      if(!result)
        mv_urlhandle(handle2, u);
      else
        curl_url_cleanup(handle2);
      return result;
    }

    /* apply the relative part to create a new URL */
    redired_url = concat_url(oldurl, part);
    free(oldurl);
    if(!redired_url)
      return CURLUE_OUT_OF_MEMORY;

    /* now parse the new URL */
    handle2 = curl_url();
    if(!handle2) {
      free(redired_url);
      return CURLUE_OUT_OF_MEMORY;
    }
    result = parseurl(redired_url, handle2, flags);
    free(redired_url);
    if(!result)
      mv_urlhandle(handle2, u);
    else
      curl_url_cleanup(handle2);
    return result;
  }
  default:
    return CURLUE_UNKNOWN_PART;
  }
  if(storep) {
    const char *newp = part;
    size_t nalloc = strlen(part);

    if(nalloc > CURL_MAX_INPUT_LENGTH)
      /* excessive input length */
      return CURLUE_MALFORMED_INPUT;

    if(urlencode) {
      const unsigned char *i;
      char *o;
      bool free_part = FALSE;
      char *enc = malloc(nalloc * 3 + 1); /* for worst case! */
      if(!enc)
        return CURLUE_OUT_OF_MEMORY;
      if(plusencode) {
        /* space to plus */
        i = (const unsigned char *)part;
        for(o = enc; *i; ++o, ++i)
          *o = (*i == ' ') ? '+' : *i;
        *o = 0; /* zero terminate */
        part = strdup(enc);
        if(!part) {
          free(enc);
          return CURLUE_OUT_OF_MEMORY;
        }
        free_part = TRUE;
      }
      for(i = (const unsigned char *)part, o = enc; *i; i++) {
        if(Curl_isunreserved(*i) ||
           ((*i == '/') && urlskipslash) ||
           ((*i == '=') && equalsencode) ||
           ((*i == '+') && plusencode)) {
          if((*i == '=') && equalsencode)
            /* only skip the first equals sign */
            equalsencode = FALSE;
          *o = *i;
          o++;
        }
        else {
          msnprintf(o, 4, "%%%02x", *i);
          o += 3;
        }
      }
      *o = 0; /* zero terminate */
      newp = enc;
      if(free_part)
        free((char *)part);
    }
    else {
      char *p;
      newp = strdup(part);
      if(!newp)
        return CURLUE_OUT_OF_MEMORY;
      p = (char *)newp;
      while(*p) {
        /* make sure percent encoded are lower case */
        if((*p == '%') && ISXDIGIT(p[1]) && ISXDIGIT(p[2]) &&
           (ISUPPER(p[1]) || ISUPPER(p[2]))) {
          p[1] = (char)TOLOWER(p[1]);
          p[2] = (char)TOLOWER(p[2]);
          p += 3;
        }
        else
          p++;
      }
    }

    if(appendquery) {
      /* Append the string onto the old query. Add a '&' separator if none is
         present at the end of the exsting query already */
      size_t querylen = u->query ? strlen(u->query) : 0;
      bool addamperand = querylen && (u->query[querylen -1] != '&');
      if(querylen) {
        size_t newplen = strlen(newp);
        char *p = malloc(querylen + addamperand + newplen + 1);
        if(!p) {
          free((char *)newp);
          return CURLUE_OUT_OF_MEMORY;
        }
        strcpy(p, u->query); /* original query */
        if(addamperand)
          p[querylen] = '&'; /* ampersand */
        strcpy(&p[querylen + addamperand], newp); /* new suffix */
        free((char *)newp);
        free(*storep);
        *storep = p;
        return CURLUE_OK;
      }
    }

    if(what == CURLUPART_HOST) {
      if(hostname_check(u, (char *)newp)) {
        free((char *)newp);
        return CURLUE_MALFORMED_INPUT;
      }
    }

    free(*storep);
    *storep = (char *)newp;
  }
  /* set after the string, to make it not assigned if the allocation above
     fails */
  if(port)
    u->portnum = port;
  return CURLUE_OK;
}